

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

void google::protobuf::compiler::php::anon_unknown_2::GenerateEnumCInit
               (EnumDescriptor *desc,Printer *printer)

{
  undefined8 this;
  size_type in_R9;
  string_view s;
  FixedMapping replacements;
  string_view local_88;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_78;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *local_58;
  undefined8 local_50;
  string_view local_48;
  undefined1 local_38 [8];
  string c_name;
  Printer *printer_local;
  EnumDescriptor *desc_local;
  
  c_name.field_2._8_8_ = printer;
  local_48 = EnumDescriptor::full_name(desc);
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
            (&local_78,(char (*) [2])0x2073f9e,(char (*) [2])0x1cf2682);
  local_50 = 1;
  s._M_str = (char *)&local_78;
  s._M_len = (size_t)local_48._M_str;
  replacements._M_len = in_R9;
  replacements._M_array = (iterator)0x1;
  local_58 = &local_78;
  absl::lts_20250127::StrReplaceAll_abi_cxx11_
            ((string *)local_38,(lts_20250127 *)local_48._M_len,s,replacements);
  this = c_name.field_2._8_8_;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_88,"  $c_name$_ModuleInit();\n");
  protobuf::io::Printer::Print<char[7],std::__cxx11::string>
            ((Printer *)this,local_88,(char (*) [7])0x1fb8d76,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void GenerateEnumCInit(const EnumDescriptor* desc, io::Printer* printer) {
  std::string c_name = absl::StrReplaceAll(desc->full_name(), {{".", "_"}});

  printer->Print("  $c_name$_ModuleInit();\n", "c_name", c_name);
}